

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          char *makefile,string *target)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string makefileName;
  string generator;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  string local_78;
  long *local_58 [2];
  long local_48 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
  pcVar1 = (make->_M_dataplus)._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + make->_M_string_length);
  std::__cxx11::string::append((char *)local_58);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (local_58);
  iVar3 = std::__cxx11::string::compare((char *)local_58);
  if (iVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,makefile,(allocator<char> *)&local_98);
    cmSystemTools::ConvertToOutputPath(&local_78,&local_c0);
    paVar6 = &local_c0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar6) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_c0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_78._M_dataplus._M_p,
               (char *)(local_78._M_string_length + (long)local_78._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_c0);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar6) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_98,", \"",target);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_c0.field_2._M_allocated_capacity = *psVar5;
      local_c0.field_2._8_8_ = plVar4[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar5;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar4;
    }
    local_c0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_c0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)paVar6);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)local_58);
    if (iVar3 != 0) {
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      iVar3 = std::__cxx11::string::compare((char *)local_58);
      sVar2 = local_78._M_string_length;
      if (iVar3 == 0) {
        strlen(makefile);
        std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)sVar2,(ulong)makefile);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,makefile,&local_99);
        cmSystemTools::ConvertToOutputPath(&local_c0,&local_98);
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      paVar6 = &local_c0.field_2;
      local_c0._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_78._M_dataplus._M_p,
                 (char *)(local_78._M_string_length + (long)local_78._M_dataplus._M_p));
      std::__cxx11::string::append((char *)&local_c0);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar6) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_98,", \"",target);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_c0.field_2._M_allocated_capacity = *psVar5;
        local_c0.field_2._8_8_ = plVar4[3];
        local_c0._M_dataplus._M_p = (pointer)paVar6;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar5;
        local_c0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_c0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar6) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0031800a;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,makefile,(allocator<char> *)&local_98);
    cmSystemTools::ConvertToOutputPath(&local_78,&local_c0);
    paVar6 = &local_c0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar6) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_c0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_78._M_dataplus._M_p,
               (char *)(local_78._M_string_length + (long)local_78._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_c0);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar6) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_98,", \"",target);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_c0.field_2._M_allocated_capacity = *psVar5;
      local_c0.field_2._8_8_ = plVar4[3];
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar5;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar4;
    }
    local_c0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_c0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)paVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
LAB_0031800a:
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
  const std::string& make, const char* makefile, const std::string& target)
{
  std::string command = "\"";
  command += make + "\"";
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "/NOLOGO", "/f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else if (generator == "Ninja") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else {
    std::string makefileName;
    if (generator == "MinGW Makefiles") {
      // no escaping of spaces in this case, see
      // https://gitlab.kitware.com/cmake/cmake/issues/10014
      makefileName = makefile;
    } else {
      makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    }
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  }
  return command;
}